

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unesctrn.cpp
# Opt level: O2

void __thiscall
icu_63::UnescapeTransliterator::handleTransliterate
          (UnescapeTransliterator *this,Replaceable *text,UTransPosition *pos,UBool isIncremental)

{
  UChar UVar1;
  UChar UVar2;
  UChar UVar3;
  UChar *pUVar4;
  UChar UVar5;
  int iVar6;
  uint ch;
  int32_t iVar7;
  undefined4 uVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  UChar32 ch_00;
  uint uVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  UnicodeString str;
  UnicodeString local_70;
  
  uVar13 = pos->start;
  iVar9 = pos->limit;
LAB_002821d6:
LAB_002821e1:
  if (iVar9 <= (int)uVar13) {
LAB_0028240f:
    pos->contextLimit = pos->contextLimit + (iVar9 - pos->limit);
    pos->limit = iVar9;
    pos->start = uVar13;
    return;
  }
  iVar6 = 0;
LAB_002821ef:
  pUVar4 = this->spec;
  UVar1 = pUVar4[iVar6];
  uVar16 = (uint)(ushort)UVar1;
  if (uVar16 == 0xffff) goto LAB_00282393;
  uVar14 = (uint)(ushort)pUVar4[(long)iVar6 + 1];
  UVar5 = pUVar4[(long)iVar6 + 2];
  UVar2 = pUVar4[(long)iVar6 + 3];
  iVar15 = iVar6 + 5;
  UVar3 = pUVar4[(long)iVar6 + 4];
  uVar12 = 0;
  do {
    uVar11 = uVar12;
    iVar6 = (int)uVar11;
    if (uVar16 == uVar11) goto LAB_0028229b;
    if (uVar11 != 0 && iVar9 <= (int)(uVar13 + iVar6)) goto LAB_00282367;
    iVar6 = (*(text->super_UObject)._vptr_UObject[9])(text);
    uVar12 = uVar11 + 1;
  } while ((UChar)iVar6 == this->spec[(long)iVar15 + uVar11]);
  iVar6 = (int)(uVar11 + 1);
LAB_0028229b:
  uVar12 = (ulong)(iVar6 + uVar13);
  if (uVar11 < uVar16) goto LAB_0028237d;
  ch_00 = 0;
  uVar16 = 0;
  do {
    uVar17 = uVar16;
    if (iVar9 <= (int)uVar12) {
      if (isIncremental != '\0') goto LAB_0028240f;
      break;
    }
    ch = (*(text->super_UObject)._vptr_UObject[10])(text,uVar12);
    iVar7 = u_digit_63(ch,(char)UVar5);
    if (iVar7 < 0) break;
    uVar12 = (ulong)(((int)uVar12 - (uint)(ch < 0x10000)) + 2);
    ch_00 = ch_00 * (char)UVar5 + iVar7;
    uVar16 = uVar16 + 1;
    uVar17 = (uint)(ushort)UVar3;
  } while ((ushort)UVar3 != uVar16);
  if ((ushort)UVar2 <= uVar17) {
    uVar11 = 0;
    do {
      uVar10 = uVar11;
      iVar6 = (int)uVar10;
      if (uVar14 == uVar10) goto LAB_00282376;
      if (iVar9 <= (int)uVar12 + iVar6) goto LAB_00282367;
      iVar6 = (*(text->super_UObject)._vptr_UObject[9])(text);
      uVar11 = uVar10 + 1;
    } while ((UChar)iVar6 == this->spec[(long)(int)(iVar15 + (uint)(ushort)UVar1) + uVar10]);
    iVar6 = (int)(uVar10 + 1);
LAB_00282376:
    uVar16 = (int)uVar12 + iVar6;
    if (uVar14 <= uVar10) {
      icu_63::UnicodeString::UnicodeString(&local_70,ch_00);
      (*(text->super_UObject)._vptr_UObject[4])(text,(ulong)uVar13,(ulong)uVar16,&local_70);
      uVar8 = local_70.fUnion.fFields.fLength;
      if (-1 < local_70.fUnion.fStackFields.fLengthAndFlags) {
        uVar8 = (int)local_70.fUnion.fStackFields.fLengthAndFlags >> 5;
      }
      iVar9 = ((iVar9 + uVar13) - uVar16) + uVar8;
      icu_63::UnicodeString::~UnicodeString(&local_70);
      goto LAB_00282393;
    }
  }
  goto LAB_0028237d;
LAB_00282367:
  if (isIncremental != '\0') goto LAB_0028240f;
LAB_0028237d:
  iVar6 = iVar15 + (uint)(ushort)UVar1 + uVar14;
  goto LAB_002821ef;
LAB_00282393:
  if ((int)uVar13 < iVar9) goto LAB_002823f0;
  goto LAB_002821e1;
LAB_002823f0:
  uVar16 = (*(text->super_UObject)._vptr_UObject[10])(text,(ulong)uVar13);
  uVar13 = (uVar13 - (uVar16 < 0x10000)) + 2;
  goto LAB_002821d6;
}

Assistant:

void UnescapeTransliterator::handleTransliterate(Replaceable& text, UTransPosition& pos,
                                                 UBool isIncremental) const {
    int32_t start = pos.start;
    int32_t limit = pos.limit;
    int32_t i, j, ipat;

    while (start < limit) {
        // Loop over the forms in spec[].  Exit this loop when we
        // match one of the specs.  Exit the outer loop if a
        // partial match is detected and isIncremental is true.
        for (j=0, ipat=0; spec[ipat] != END; ++j) {

            // Read the header
            int32_t prefixLen = spec[ipat++];
            int32_t suffixLen = spec[ipat++];
            int8_t  radix     = (int8_t) spec[ipat++];
            int32_t minDigits = spec[ipat++];
            int32_t maxDigits = spec[ipat++];

            // s is a copy of start that is advanced over the
            // characters as we parse them.
            int32_t s = start;
            UBool match = TRUE;

            for (i=0; i<prefixLen; ++i) {
                if (s >= limit) {
                    if (i > 0) {
                        // We've already matched a character.  This is
                        // a partial match, so we return if in
                        // incremental mode.  In non-incremental mode,
                        // go to the next spec.
                        if (isIncremental) {
                            goto exit;
                        }
                        match = FALSE;
                        break;
                    }
                }
                UChar c = text.charAt(s++);
                if (c != spec[ipat + i]) {
                    match = FALSE;
                    break;
                }
            }

            if (match) {
                UChar32 u = 0;
                int32_t digitCount = 0;
                for (;;) {
                    if (s >= limit) {
                        // Check for partial match in incremental mode.
                        if (s > start && isIncremental) {
                            goto exit;
                        }
                        break;
                    }
                    UChar32 ch = text.char32At(s);
                    int32_t digit = u_digit(ch, radix);
                    if (digit < 0) {
                        break;
                    }
                    s += U16_LENGTH(ch);
                    u = (u * radix) + digit;
                    if (++digitCount == maxDigits) {
                        break;
                    }
                }

                match = (digitCount >= minDigits);

                if (match) {
                    for (i=0; i<suffixLen; ++i) {
                        if (s >= limit) {
                            // Check for partial match in incremental mode.
                            if (s > start && isIncremental) {
                                goto exit;
                            }
                            match = FALSE;
                            break;
                        }
                        UChar c = text.charAt(s++);
                        if (c != spec[ipat + prefixLen + i]) {
                            match = FALSE;
                            break;
                        }
                    }

                    if (match) {
                        // At this point, we have a match
                        UnicodeString str(u);
                        text.handleReplaceBetween(start, s, str);
                        limit -= s - start - str.length();
                        // The following break statement leaves the
                        // loop that is traversing the forms in
                        // spec[].  We then parse the next input
                        // character.
                        break;
                    }
                }
            }

            ipat += prefixLen + suffixLen;
        }

        if (start < limit) {
            start += U16_LENGTH(text.char32At(start));
        }
    }

  exit:
    pos.contextLimit += limit - pos.limit;
    pos.limit = limit;
    pos.start = start;
}